

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_PassObj_Test::TestBody(NLReaderTest_PassObj_Test *this)

{
  ReturnAction<bool> RVar1;
  MockSpec<bool_(int)> *this_00;
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *__lhs;
  NLHeader header;
  NiceMock<MockNLHandler> handler;
  string *in_stack_fffffffffffffa88;
  MockNLHandler *in_stack_fffffffffffffa90;
  NLHeader *this_01;
  Matcher<int> *in_stack_fffffffffffffa98;
  MockNLHandler *in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffab8;
  BasicCStringRef<char> in_stack_fffffffffffffac0;
  string local_538 [32];
  string local_518 [32];
  Action<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *in_stack_fffffffffffffb08;
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *in_stack_fffffffffffffb10;
  int local_4e8;
  int local_4e0;
  char *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb94;
  char *in_stack_fffffffffffffb98;
  MockSpec<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffc74;
  int iVar2;
  NiceMock<MockNLHandler> *in_stack_fffffffffffffc78;
  CStringRef in_stack_fffffffffffffc80;
  NLStringRef in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffd07;
  NLHeader *in_stack_fffffffffffffd08;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  testing::NiceMock<MockNLHandler>::NiceMock((NiceMock<MockNLHandler> *)in_stack_fffffffffffffaa0);
  testing::Matcher<int>::Matcher((Matcher<int> *)in_stack_fffffffffffffac0.data_,iVar2);
  this_00 = MockNLHandler::gmock_NeedObj
                      (in_stack_fffffffffffffa90,(Matcher<int> *)in_stack_fffffffffffffa88);
  testing::internal::MockSpec<bool_(int)>::InternalExpectedAt
            ((MockSpec<bool_(int)> *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  RVar1 = testing::Return<bool>(false);
  iVar2 = CONCAT13(RVar1.value_,(int3)in_stack_fffffffffffffc74);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction<bool> *)this_00);
  testing::internal::TypedExpectation<bool_(int)>::WillOnce
            ((TypedExpectation<bool_(int)> *)in_stack_fffffffffffffb10,
             (Action<bool_(int)> *)in_stack_fffffffffffffb08);
  testing::Action<bool_(int)>::~Action((Action<bool_(int)> *)0x163237);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x163244);
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffffac0.data_,(int)((ulong)this_00 >> 0x20));
  testing::Matcher<int>::Matcher
            ((Matcher<int> *)in_stack_fffffffffffffac0.data_,(int)((ulong)this_00 >> 0x20));
  MockNLHandler::gmock_OnLinearObjExpr
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
             (Matcher<int> *)in_stack_fffffffffffffa90);
  __lhs = testing::internal::
          MockSpec<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>::
          InternalExpectedAt(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                             in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                             in_stack_fffffffffffffb80);
  testing::Return<mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::LinearExprHandler>();
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler> *)
             this_00);
  testing::internal::
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>::
  WillOnce(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  testing::Action<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>::
  ~Action((Action<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)> *)
          0x1632f7);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x163304);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x163311);
  this_01 = (NLHeader *)&local_4e8;
  memset(this_01,0,0x110);
  mp::NLHeader::NLHeader(this_01);
  local_4e0 = 1;
  local_4e8 = 1;
  FormatHeader_abi_cxx11_(in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffd07);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)this_01);
  mp::NLStringRef::NLStringRef((NLStringRef *)this_01,in_stack_fffffffffffffa88);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xfffffffffffffac0,"(input)");
  mp::ReadNLString<testing::NiceMock<MockNLHandler>>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc78,in_stack_fffffffffffffc80,iVar2);
  std::__cxx11::string::~string(local_518);
  std::__cxx11::string::~string(local_538);
  testing::NiceMock<MockNLHandler>::~NiceMock((NiceMock<MockNLHandler> *)this_01);
  return;
}

Assistant:

TEST(NLReaderTest, PassObj) {
  testing::NiceMock<MockNLHandler> handler;
  EXPECT_CALL(handler, NeedObj(0)).WillOnce(Return(true));
  EXPECT_CALL(handler, OnLinearObjExpr(0, 1)).
      WillOnce(Return(MockNLHandler::LinearObjHandler()));
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header) + "G0 1\n0 1\n", handler);
}